

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O2

bool __thiscall
sf::priv::CursorImpl::loadFromPixelsARGB
          (CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  size_t pixelIndex;
  long lVar1;
  ulong uVar2;
  Cursor CVar3;
  
  lVar1 = XcursorImageCreate((ulong)size & 0xffffffff,(ulong)size >> 0x20);
  *(Vector2u *)(lVar1 + 0x10) = hotspot;
  for (uVar2 = 0; size.y * size.x != uVar2; uVar2 = uVar2 + 1) {
    *(uint *)(*(long *)(lVar1 + 0x20) + uVar2 * 4) =
         CONCAT13(pixels[uVar2 * 4 + 3],
                  CONCAT12(pixels[uVar2 * 4],
                           *(ushort *)(pixels + uVar2 * 4 + 1) << 8 |
                           *(ushort *)(pixels + uVar2 * 4 + 1) >> 8));
  }
  CVar3 = XcursorImageLoadCursor(this->m_display,lVar1);
  this->m_cursor = CVar3;
  XcursorImageDestroy(lVar1);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixelsARGB(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    // Create cursor image, convert from RGBA to ARGB.
    XcursorImage* cursorImage = XcursorImageCreate(static_cast<int>(size.x), static_cast<int>(size.y));
    cursorImage->xhot = hotspot.x;
    cursorImage->yhot = hotspot.y;

    const std::size_t numPixels = size.x * size.y;
    for (std::size_t pixelIndex = 0; pixelIndex < numPixels; ++pixelIndex)
    {
        cursorImage->pixels[pixelIndex] = static_cast<Uint32>(pixels[pixelIndex * 4 + 2] +
                                                              (pixels[pixelIndex * 4 + 1] << 8) +
                                                              (pixels[pixelIndex * 4 + 0] << 16) +
                                                              (pixels[pixelIndex * 4 + 3] << 24));
    }

    // Create the cursor.
    m_cursor = XcursorImageLoadCursor(m_display, cursorImage);

    // Free the resources
    XcursorImageDestroy(cursorImage);

    // We assume everything went fine...
    return true;
}